

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O0

size_t __thiscall proto2_unittest::ComplexOptionType2::ByteSizeLong(ComplexOptionType2 *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int32_t value;
  RepeatedPtrField<proto2_unittest::ComplexOptionType2_ComplexOptionType4> *this_00;
  reference value_00;
  uint32_t *puVar4;
  size_t sVar5;
  ComplexOptionType2_ComplexOptionType4 *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<proto2_unittest::ComplexOptionType2_ComplexOptionType4> *__range2;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  ComplexOptionType2 *this_;
  ComplexOptionType2 *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sStack_58 = google::protobuf::internal::ExtensionSet::ByteSize
                        (&(this->field_0)._impl_._extensions_);
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  iVar3 = _internal_barney_size(this);
  sStack_58 = (long)iVar3 + sStack_58;
  this_00 = _internal_barney(this);
  __end2 = google::protobuf::
           RepeatedPtrField<proto2_unittest::ComplexOptionType2_ComplexOptionType4>::begin(this_00);
  msg = (ComplexOptionType2_ComplexOptionType4 *)
        google::protobuf::RepeatedPtrField<proto2_unittest::ComplexOptionType2_ComplexOptionType4>::
        end(this_00);
  while (bVar2 = google::protobuf::internal::operator!=(&__end2,(iterator *)&msg), bVar2) {
    value_00 = google::protobuf::internal::
               RepeatedPtrIterator<const_proto2_unittest::ComplexOptionType2_ComplexOptionType4>::
               operator*(&__end2);
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<proto2_unittest::ComplexOptionType2_ComplexOptionType4>(value_00);
    sStack_58 = sVar5 + sStack_58;
    google::protobuf::internal::
    RepeatedPtrIterator<const_proto2_unittest::ComplexOptionType2_ComplexOptionType4>::operator++
              (&__end2);
  }
  puVar4 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar4;
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto2_unittest::ComplexOptionType1>((this->field_0)._impl_.bar_);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto2_unittest::ComplexOptionType2_ComplexOptionType4>
                        ((this->field_0)._impl_.fred_);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
    if ((uVar1 & 4) != 0) {
      value = _internal_baz(this);
      sVar5 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(value);
      sStack_58 = sVar5 + sStack_58;
    }
  }
  sVar5 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t ComplexOptionType2::ByteSizeLong() const {
  const ComplexOptionType2& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.ComplexOptionType2)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto2_unittest.ComplexOptionType2.ComplexOptionType4 barney = 4;
    {
      total_size += 1UL * this_._internal_barney_size();
      for (const auto& msg : this_._internal_barney()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    // optional .proto2_unittest.ComplexOptionType1 bar = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.bar_);
    }
    // optional .proto2_unittest.ComplexOptionType2.ComplexOptionType4 fred = 3;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.fred_);
    }
    // optional int32 baz = 2;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_baz());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}